

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<double,_4UL>_> *value)

{
  bool bVar1;
  double4 v;
  array<double,_4UL> local_30;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<double,4ul>(this,&local_30);
    if (bVar1) {
      *(double *)&value->contained = local_30._M_elems[0];
      *(double *)((long)&value->contained + 8) = local_30._M_elems[1];
      *(double *)((long)&value->contained + 0x10) = local_30._M_elems[2];
      *(double *)((long)&value->contained + 0x18) = local_30._M_elems[3];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::double4> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::double4 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}